

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O0

parser_error parse_prefs_keymap_action(parser *p)

{
  _Bool _Var1;
  byte *pbVar2;
  prefs_data *d;
  char *act;
  parser *p_local;
  
  d = (prefs_data *)0x2b7ea9;
  pbVar2 = (byte *)parser_priv(p);
  if (pbVar2 == (byte *)0x0) {
    __assert_fail("d != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                  ,0x3b4,"enum parser_error parse_prefs_keymap_action(struct parser *)");
  }
  if ((*pbVar2 & 1) == 0) {
    _Var1 = parser_hasval(p,"act");
    if (_Var1) {
      d = (prefs_data *)parser_getstr(p,"act");
    }
    keypress_from_text((keypress *)(pbVar2 + 4),0x14,&d->bypass);
  }
  return PARSE_ERROR_NONE;
}

Assistant:

static enum parser_error parse_prefs_keymap_action(struct parser *p)
{
	const char *act = "";

	struct prefs_data *d = parser_priv(p);	
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	if (parser_hasval(p, "act")) {
		act = parser_getstr(p, "act");
	}
	keypress_from_text(d->keymap_buffer, N_ELEMENTS(d->keymap_buffer), act);

	return PARSE_ERROR_NONE;
}